

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feed.c
# Opt level: O3

int equal_feeds(feed_t *a,feed_t *b)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  
  uVar4 = 0;
  uVar5 = 0;
  if (((((a->agency_count == b->agency_count) &&
        (iVar1 = a->calendar_dates_count, iVar1 == b->calendar_dates_count)) &&
       (a->calendar_records_count == b->calendar_records_count)) &&
      (((uVar4 = uVar5, a->fare_attributes_count == b->fare_attributes_count &&
        (a->fare_rules_count == b->fare_rules_count)) &&
       ((a->feed_info_count == b->feed_info_count &&
        ((a->frequencies_count == b->frequencies_count && (a->levels_count == b->levels_count)))))))
      ) && ((a->pathways_count == b->pathways_count &&
            (((((a->routes_count == b->routes_count && (a->shapes_count == b->shapes_count)) &&
               (a->stop_times_count == b->stop_times_count)) &&
              ((a->stops_count == b->stops_count && (a->transfers_count == b->transfers_count)))) &&
             (a->trips_count == b->trips_count)))))) {
    if (0 < a->agency_count) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        iVar1 = equal_agency((agency_t *)(a->agencies->id + lVar2),
                             (agency_t *)(b->agencies->id + lVar2));
        if (iVar1 == 0) {
          return 0;
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x280;
      } while (lVar3 < a->agency_count);
      iVar1 = a->calendar_dates_count;
    }
    if (0 < iVar1) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        iVar1 = equal_calendar_date((calendar_date_t *)(a->calendar_dates->service_id + lVar2),
                                    (calendar_date_t *)(b->calendar_dates->service_id + lVar2));
        if (iVar1 == 0) {
          return 0;
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x50;
      } while (lVar3 < a->calendar_dates_count);
    }
    if (0 < a->calendar_records_count) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        iVar1 = equal_calendar_record
                          ((calendar_record_t *)(a->calendar_records->service_id + lVar2),
                           (calendar_record_t *)(b->calendar_records->service_id + lVar2));
        if (iVar1 == 0) {
          return 0;
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x70;
      } while (lVar3 < a->calendar_records_count);
    }
    if (0 < a->fare_attributes_count) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        iVar1 = equal_fare_attributes
                          ((fare_attributes_t *)(a->fare_attributes->fare_id + lVar2),
                           (fare_attributes_t *)(b->fare_attributes->fare_id + lVar2));
        if (iVar1 == 0) {
          return 0;
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0xa0;
      } while (lVar3 < a->fare_attributes_count);
    }
    if (0 < a->fare_rules_count) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        iVar1 = equal_fare_rule((fare_rule_t *)(a->fare_rules->fare_id + lVar2),
                                (fare_rule_t *)(b->fare_rules->fare_id + lVar2));
        if (iVar1 == 0) {
          return 0;
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x140;
      } while (lVar3 < a->fare_rules_count);
    }
    if (0 < a->feed_info_count) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        iVar1 = equal_feed_info((feed_info_t *)(a->feed_info->feed_publisher_name + lVar2),
                                (feed_info_t *)(b->feed_info->feed_publisher_name + lVar2));
        if (iVar1 == 0) {
          return 0;
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x212;
      } while (lVar3 < a->feed_info_count);
    }
    if (0 < a->frequencies_count) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        iVar1 = equal_frequency((frequency_t *)(a->frequencies->trip_id + lVar2),
                                (frequency_t *)(b->frequencies->trip_id + lVar2));
        if (iVar1 == 0) {
          return 0;
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x5c;
      } while (lVar3 < a->frequencies_count);
    }
    if (0 < a->levels_count) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        iVar1 = equal_level((level_t *)(a->levels->id + lVar2),(level_t *)(b->levels->id + lVar2));
        if (iVar1 == 0) {
          return 0;
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x88;
      } while (lVar3 < a->levels_count);
    }
    if (0 < a->pathways_count) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        iVar1 = equal_pathway((pathway_t *)(a->pathways->id + lVar2),
                              (pathway_t *)(b->pathways->id + lVar2));
        if (iVar1 == 0) {
          return 0;
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x1e8;
      } while (lVar3 < a->pathways_count);
    }
    if (0 < a->routes_count) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        iVar1 = equal_route((route_t *)(a->routes->id + lVar2),(route_t *)(b->routes->id + lVar2));
        if (iVar1 == 0) {
          return 0;
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x2d8;
      } while (lVar3 < a->routes_count);
    }
    if (0 < a->shapes_count) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        iVar1 = equal_shape((shape_t *)(a->shapes->id + lVar2),(shape_t *)(b->shapes->id + lVar2));
        if (iVar1 == 0) {
          return 0;
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x70;
      } while (lVar3 < a->shapes_count);
    }
    if (0 < a->stop_times_count) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        iVar1 = equal_stop_time((stop_time_t *)(a->stop_times->trip_id + lVar2),
                                (stop_time_t *)(b->stop_times->trip_id + lVar2));
        if (iVar1 == 0) {
          return 0;
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0xf0;
      } while (lVar3 < a->stop_times_count);
    }
    if (0 < a->stops_count) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        iVar1 = equal_stop((stop_t *)(a->stops->id + lVar2),(stop_t *)(b->stops->id + lVar2));
        if (iVar1 == 0) {
          return 0;
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x3b0;
      } while (lVar3 < a->stops_count);
    }
    if (0 < a->transfers_count) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        iVar1 = equal_transfer((transfer_t *)(a->transfers->from_stop_id + lVar2),
                               (transfer_t *)(b->transfers->from_stop_id + lVar2));
        if (iVar1 == 0) {
          return 0;
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x88;
      } while (lVar3 < a->transfers_count);
    }
    if (a->trips_count < 1) {
      uVar4 = 1;
    }
    else {
      lVar3 = 0;
      lVar2 = 0;
      do {
        iVar1 = equal_trip((trip_t *)(a->trips->route_id + lVar3),
                           (trip_t *)(b->trips->route_id + lVar3));
        if (iVar1 == 0) break;
        lVar2 = lVar2 + 1;
        lVar3 = lVar3 + 0x1cc;
      } while (lVar2 < a->trips_count);
      uVar4 = (uint)(iVar1 != 0);
    }
  }
  return uVar4;
}

Assistant:

int equal_feeds(const feed_t *a, const feed_t *b) {
    if (a->agency_count != b->agency_count)
        return 0;

    if (a->calendar_dates_count != b->calendar_dates_count)
        return 0;

    if (a->calendar_records_count != b->calendar_records_count)
        return 0;

    if (a->fare_attributes_count != b->fare_attributes_count)
        return 0;

    if (a->fare_rules_count != b->fare_rules_count)
        return 0;

    if (a->feed_info_count != b->feed_info_count)
        return 0;

    if (a->frequencies_count != b->frequencies_count)
        return 0;

    if (a->levels_count != b->levels_count)
        return 0;

    if (a->pathways_count != b->pathways_count)
        return 0;

    if (a->routes_count != b->routes_count)
        return 0;

    if (a->shapes_count != b->shapes_count)
        return 0;

    if (a->stop_times_count != b->stop_times_count)
        return 0;

    if (a->stops_count != b->stops_count)
        return 0;

    if (a->transfers_count != b->transfers_count)
        return 0;

    if (a->trips_count != b->trips_count)
        return 0;


    for (int i = 0; i < a->agency_count; i++)
        if (!equal_agency(&(a->agencies[i]), &(b->agencies[i])))
            return 0;

    for (int i = 0; i < a->calendar_dates_count; i++)
        if (!equal_calendar_date(&(a->calendar_dates[i]), &(b->calendar_dates[i])))
            return 0;

    for (int i = 0; i < a->calendar_records_count; i++)
        if (!equal_calendar_record(&(a->calendar_records[i]), &(b->calendar_records[i])))
            return 0;

    for (int i = 0; i < a->fare_attributes_count; i++)
        if (!equal_fare_attributes(&(a->fare_attributes[i]), &(b->fare_attributes[i])))
            return 0;

    for (int i = 0; i < a->fare_rules_count; i++)
        if (!equal_fare_rule(&(a->fare_rules[i]), &(b->fare_rules[i])))
            return 0;

    for (int i = 0; i < a->feed_info_count; i++)
        if (!equal_feed_info(&(a->feed_info[i]), &(b->feed_info[i])))
            return 0;

    for (int i = 0; i < a->frequencies_count; i++)
        if (!equal_frequency(&(a->frequencies[i]), &(b->frequencies[i])))
            return 0;

    for (int i = 0; i < a->levels_count; i++)
        if (!equal_level(&(a->levels[i]), &(b->levels[i])))
            return 0;

    for (int i = 0; i < a->pathways_count; i++)
        if (!equal_pathway(&(a->pathways[i]), &(b->pathways[i])))
            return 0;

    for (int i = 0; i < a->routes_count; i++)
        if (!equal_route(&(a->routes[i]), &(b->routes[i])))
            return 0;

    for (int i = 0; i < a->shapes_count; i++)
        if (!equal_shape(&(a->shapes[i]), &(b->shapes[i])))
            return 0;

    for (int i = 0; i < a->stop_times_count; i++)
        if (!equal_stop_time(&(a->stop_times[i]), &(b->stop_times[i])))
            return 0;

    for (int i = 0; i < a->stops_count; i++)
        if (!equal_stop(&(a->stops[i]), &(b->stops[i])))
            return 0;

    for (int i = 0; i < a->transfers_count; i++)
        if (!equal_transfer(&(a->transfers[i]), &(b->transfers[i])))
            return 0;

    for (int i = 0; i < a->trips_count; i++)
        if (!equal_trip(&(a->trips[i]), &(b->trips[i])))
            return 0;

    return 1;
}